

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

TermList ApplicativeHelper::createAppTerm(TermList sort,TermList head,TermStack *terms)

{
  TermList s1;
  ulong uVar1;
  
  uVar1 = (ulong)((long)terms->_cursor - (long)terms->_stack) >> 3 & 0xffffffff;
  while( true ) {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) break;
    s1 = getNthArg(sort,1);
    sort = getResultApplieadToNArgs(sort,1);
    head = createAppTerm(s1,sort,head,terms->_stack[(uint)uVar1 & 0x7fffffff]._content,true);
  }
  return (TermList)head._content;
}

Assistant:

TermList ApplicativeHelper::createAppTerm(TermList sort, TermList head, TermStack& terms)
{
  ASS(head.isVar() || SortHelper::getResultSort(head.term()) == sort);

  TermList res = head;
  TermList s1, s2;
  
  for(int i = terms.size() - 1; i >= 0; i--){
    s1 = getNthArg(sort, 1);
    s2 = getResultApplieadToNArgs(sort, 1);
    res = createAppTerm(s1, s2, res, terms[i]);
    sort = s2;
  }
  return res; 

}